

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O2

int64_t GetBlockProofEquivalentTime
                  (CBlockIndex *to,CBlockIndex *from,CBlockIndex *tip,Params *params)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  arith_uint256 *a;
  arith_uint256 *b;
  long in_FS_OFFSET;
  long lStack_100;
  base_uint<256U> local_f0;
  base_uint<256U> local_d0;
  base_uint<256U> local_b0;
  base_uint<256U> local_90;
  base_uint<256U> local_70;
  arith_uint256 r;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  base_uint<256U>::base_uint(&r.super_base_uint<256U>);
  a = &to->nChainWork;
  b = &from->nChainWork;
  bVar2 = operator>(&a->super_base_uint<256U>,&b->super_base_uint<256U>);
  if (bVar2) {
    operator-(&local_90,&a->super_base_uint<256U>,&b->super_base_uint<256U>);
    base_uint<256U>::base_uint(&local_70,&local_90);
    base_uint<256U>::operator=(&r.super_base_uint<256U>,&local_70);
    lStack_100 = 1;
  }
  else {
    operator-(&local_90,&b->super_base_uint<256U>,&a->super_base_uint<256U>);
    base_uint<256U>::base_uint(&local_70,&local_90);
    base_uint<256U>::operator=(&r.super_base_uint<256U>,&local_70);
    lStack_100 = -1;
  }
  base_uint<256U>::base_uint(&local_d0,params->nPowTargetSpacing);
  operator*(&local_b0,&r.super_base_uint<256U>,&local_d0);
  GetBlockProof((arith_uint256 *)&local_f0,tip);
  operator/(&local_90,&local_b0,&local_f0);
  base_uint<256U>::base_uint(&local_70,&local_90);
  base_uint<256U>::operator=(&r.super_base_uint<256U>,&local_70);
  uVar3 = base_uint<256U>::bits(&r.super_base_uint<256U>);
  if (0x3f < uVar3) {
    r.super_base_uint<256U>.pn._0_8_ = 0x7fffffffffffffff;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return r.super_base_uint<256U>.pn._0_8_ * lStack_100;
}

Assistant:

int64_t GetBlockProofEquivalentTime(const CBlockIndex& to, const CBlockIndex& from, const CBlockIndex& tip, const Consensus::Params& params)
{
    arith_uint256 r;
    int sign = 1;
    if (to.nChainWork > from.nChainWork) {
        r = to.nChainWork - from.nChainWork;
    } else {
        r = from.nChainWork - to.nChainWork;
        sign = -1;
    }
    r = r * arith_uint256(params.nPowTargetSpacing) / GetBlockProof(tip);
    if (r.bits() > 63) {
        return sign * std::numeric_limits<int64_t>::max();
    }
    return sign * int64_t(r.GetLow64());
}